

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cond.cpp
# Opt level: O1

void __thiscall Hpipe::Cond::Range::write_cpp(Range *this,ostream *os,string *var,bool in_or)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  ostream *poVar4;
  undefined7 in_register_00000009;
  size_type sVar5;
  char *pcVar6;
  pointer pcVar7;
  int *piVar8;
  bool bVar9;
  
  if ((int)CONCAT71(in_register_00000009,in_or) == 0) {
LAB_00144b49:
    bVar9 = false;
  }
  else {
    if (this->beg == this->end) goto LAB_00144b49;
    bVar9 = true;
    if (this->beg == 0 || 0xfe < this->end) {
      bVar9 = (this->exceptions).super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish !=
              (this->exceptions).super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      ;
    }
  }
  if (bVar9) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"( ",2);
  }
  iVar3 = this->beg;
  iVar1 = this->end;
  if (iVar3 == iVar1) {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(var->_M_dataplus)._M_p,var->_M_string_length);
    pcVar6 = " == ";
LAB_00144b8e:
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,4);
    iVar3 = this->beg;
LAB_00144c74:
    cc(poVar4,iVar3);
  }
  else {
    if (iVar1 < 0xff && iVar3 != 0) {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,(var->_M_dataplus)._M_p,var->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," >= ",4);
      poVar4 = cc(poVar4,this->beg);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," and ",5);
      pcVar7 = (var->_M_dataplus)._M_p;
      sVar5 = var->_M_string_length;
LAB_00144c54:
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," <= ",4);
      iVar3 = this->end;
      goto LAB_00144c74;
    }
    if (iVar1 < 0xff) {
      pcVar7 = (var->_M_dataplus)._M_p;
      sVar5 = var->_M_string_length;
      poVar4 = os;
      goto LAB_00144c54;
    }
    if (iVar3 != 0) {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,(var->_M_dataplus)._M_p,var->_M_string_length);
      pcVar6 = " >= ";
      goto LAB_00144b8e;
    }
    iVar3 = 0;
    if ((this->exceptions).super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
        (this->exceptions).super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish)
    goto LAB_00144c81;
    std::__ostream_insert<char,std::char_traits<char>>(os,"true",4);
  }
  iVar3 = 1;
LAB_00144c81:
  piVar2 = (this->exceptions).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  for (piVar8 = (this->exceptions).super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start; piVar8 != piVar2; piVar8 = piVar8 + 1) {
    iVar1 = *piVar8;
    pcVar6 = " and ";
    if (iVar3 == 0) {
      pcVar6 = "";
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar6,(ulong)(iVar3 != 0) * 5);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(var->_M_dataplus)._M_p,var->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," != ",4);
    cc(poVar4,iVar1);
    iVar3 = iVar3 + 1;
  }
  if (bVar9) {
    std::__ostream_insert<char,std::char_traits<char>>(os," )",2);
    return;
  }
  return;
}

Assistant:

void Cond::Range::write_cpp( std::ostream &os, const std::string &var, bool in_or ) const {
    bool par = in_or and beg != end and ( ( beg and end < 255 ) or exceptions.size() );
    if ( par )
        os << "( ";

    int cpt = 1;
    if ( beg == end )
        cc( os << var << " == ", beg );
    else if ( beg and end < 255 )
        cc( cc( os <<  var << " >= ", beg ) << " and " << var << " <= ", end );
    else if ( end < 255 )
        cc( os << var << " <= ", end );
    else if ( beg )
        cc( os << var << " >= ", beg );
    else if ( exceptions.empty() )
        os << "true";
    else
        cpt = 0;

    for( int v : exceptions )
        cc( os << ( cpt++ ? " and " : "" ) << var << " != ", v );

    if ( par )
        os << " )";
}